

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

uint GetSplitCopyCount(VmInstruction *inst,uint marker)

{
  VmValueType VVar1;
  VmValue **ppVVar2;
  uint uVar3;
  VmValue *pVVar4;
  ulong uVar5;
  uint uVar6;
  VmInstruction *pVVar7;
  VmInstruction *pVVar8;
  ulong uVar9;
  VmValueType VVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  
  uVar13 = 0;
  if (inst->regVmSearchMarker != marker) {
    inst->regVmSearchMarker = marker;
    uVar13 = 0;
    if ((inst->cmd == VM_INST_PHI) && (uVar13 = 0, (inst->arguments).count != 0)) {
      uVar13 = 0;
      uVar12 = 0;
      do {
        pVVar7 = (VmInstruction *)(inst->arguments).data[uVar12];
        if ((pVVar7 == (VmInstruction *)0x0) || ((pVVar7->super_VmValue).typeID != 2)) {
          pVVar7 = (VmInstruction *)0x0;
        }
        uVar3 = GetSplitCopyCount(pVVar7,marker);
        uVar13 = uVar13 + uVar3;
        uVar3 = (int)uVar12 + 2;
        uVar12 = (ulong)uVar3;
      } while (uVar3 < (inst->arguments).count);
    }
    if (inst->cmd == VM_INST_MOV) {
      if ((inst->arguments).count == 0) {
LAB_001bd96f:
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,
                      "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                     );
      }
      pVVar4 = *(inst->arguments).data;
      if ((pVVar4 == (VmValue *)0x0) || (pVVar4->typeID != 2)) {
        pVVar4 = (VmValue *)0x0;
      }
      if (inst->color != 0) {
        uVar13 = uVar13 + (inst->color == *(uint *)(pVVar4[1].users.little + 7));
      }
    }
    if ((inst->cmd == VM_INST_DEF) &&
       (uVar12 = (ulong)(inst->super_VmValue).users.count, uVar12 != 0)) {
      uVar5 = 0;
      do {
        pVVar4 = (inst->super_VmValue).users.data[uVar5];
        if ((pVVar4 == (VmValue *)0x0) || (pVVar4->typeID != 2)) {
          pVVar4 = (VmValue *)0x0;
        }
        if (((pVVar4 != (VmValue *)0x0) && (*(int *)&pVVar4[1]._vptr_VmValue == 0x51)) &&
           (VVar1 = pVVar4[1].type.type, VVar1 != VM_TYPE_VOID)) {
          uVar9 = 0;
          do {
            pVVar7 = *(VmInstruction **)(*(long *)&pVVar4[1].typeID + uVar9 * 8);
            if ((pVVar7 == (VmInstruction *)0x0) || ((pVVar7->super_VmValue).typeID != 2)) {
              pVVar7 = (VmInstruction *)0x0;
            }
            VVar10 = (int)uVar9 + VM_TYPE_INT;
            if (VVar1 <= VVar10) goto LAB_001bd96f;
            lVar11 = *(long *)(*(long *)&pVVar4[1].typeID + (ulong)VVar10 * 8);
            if ((lVar11 == 0) || (*(int *)(lVar11 + 8) != 2)) {
              lVar11 = 0;
            }
            if (pVVar7 == (VmInstruction *)0x0) {
              __assert_fail("destination",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1c93,"unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)")
              ;
            }
            if (lVar11 == 0) {
              __assert_fail("source",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1c94,"unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)")
              ;
            }
            if ((pVVar7 == inst) && (inst->color != 0)) {
              uVar13 = uVar13 + (inst->color == *(uint *)(lVar11 + 0x120));
            }
            VVar10 = (int)uVar9 + VM_TYPE_DOUBLE;
            uVar9 = (ulong)VVar10;
          } while (VVar10 < VVar1);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar12);
    }
    if ((inst->super_VmValue).users.count != 0) {
      uVar12 = 0;
      do {
        pVVar7 = (VmInstruction *)(inst->super_VmValue).users.data[uVar12];
        if ((pVVar7 == (VmInstruction *)0x0) || ((pVVar7->super_VmValue).typeID != 2)) {
          pVVar7 = (VmInstruction *)0x0;
        }
        if (pVVar7->cmd == VM_INST_PHI) {
          uVar3 = GetSplitCopyCount(pVVar7,marker);
          uVar13 = uVar13 + uVar3;
        }
        if (pVVar7->cmd == VM_INST_MOV) {
          if ((pVVar7->arguments).count == 0) goto LAB_001bd96f;
          if ((VmInstruction *)*(pVVar7->arguments).data != inst) {
            __assert_fail("inst == instruction->arguments[0]",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1ca9,"unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)");
          }
          if (pVVar7->color != 0) {
            uVar13 = uVar13 + (pVVar7->color == inst->color);
          }
        }
        if ((pVVar7->cmd == VM_INST_PARALLEL_COPY) &&
           (uVar3 = (pVVar7->arguments).count, uVar3 != 0)) {
          ppVVar2 = (pVVar7->arguments).data;
          uVar5 = 0;
          do {
            pVVar4 = ppVVar2[uVar5];
            if ((pVVar4 == (VmValue *)0x0) || (pVVar4->typeID != 2)) {
              pVVar4 = (VmValue *)0x0;
            }
            uVar6 = (int)uVar5 + 1;
            if (uVar3 <= uVar6) goto LAB_001bd96f;
            pVVar8 = (VmInstruction *)ppVVar2[uVar6];
            if ((pVVar8 == (VmInstruction *)0x0) || ((pVVar8->super_VmValue).typeID != 2)) {
              pVVar8 = (VmInstruction *)0x0;
            }
            if (pVVar4 == (VmValue *)0x0) {
              __assert_fail("destination",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1cb6,"unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)")
              ;
            }
            if (pVVar8 == (VmInstruction *)0x0) {
              __assert_fail("source",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1cb7,"unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)")
              ;
            }
            if ((pVVar8 == inst) && (pVVar7->color != 0)) {
              uVar13 = uVar13 + (pVVar7->color == *(uint *)(pVVar4[1].users.little + 7));
            }
            uVar6 = (int)uVar5 + 2;
            uVar5 = (ulong)uVar6;
          } while (uVar6 < uVar3);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < (inst->super_VmValue).users.count);
    }
  }
  return uVar13;
}

Assistant:

unsigned GetSplitCopyCount(VmInstruction *inst, unsigned marker)
{
	if(inst->regVmSearchMarker == marker)
		return 0;

	inst->regVmSearchMarker = marker;

	unsigned count = 0;

	if(inst->cmd == VM_INST_PHI)
	{
		for(unsigned argument = 0; argument < inst->arguments.size(); argument += 2)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->arguments[argument]);

			count += GetSplitCopyCount(instruction, marker);
		}
	}

	if(inst->cmd == VM_INST_MOV)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->arguments[0]);

		if(inst->color != 0 && inst->color == instruction->color)
			count++;
	}

	if(inst->cmd == VM_INST_DEF)
	{
		for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

			if(instruction && instruction->cmd == VM_INST_PARALLEL_COPY)
			{
				for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
				{
					VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
					VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

					assert(destination);
					assert(source);

					if(inst == destination)
					{
						if(inst->color != 0 && inst->color == source->color)
							count++;
					}
				}
			}
		}
	}

	for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

		if(instruction->cmd == VM_INST_PHI)
			count += GetSplitCopyCount(instruction, marker);

		if(instruction->cmd == VM_INST_MOV)
		{
			assert(inst == instruction->arguments[0]);

			if(instruction->color != 0 && instruction->color == inst->color)
				count++;
		}

		if(instruction->cmd == VM_INST_PARALLEL_COPY)
		{
			for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
			{
				VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
				VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

				assert(destination);
				assert(source);

				if(inst == source)
				{
					if(instruction->color != 0 && instruction->color == destination->color)
						count++;
				}
			}
		}
	}

	return count;
}